

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O1

void __thiscall
nodecpp::log::Log::log<char_const*,char_const*,int,char_const*>
          (Log *this,ModuleID *mid,LogLevel l,char *format_str,char *obj,int obj_1,char *obj_2)

{
  pointer pLVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  LogTransport *transport;
  pointer this_00;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  char msgFormatted [4096];
  ModuleID local_11a8;
  buffer<char> local_11a0;
  ulong local_1180;
  long local_1178;
  char *local_1170;
  char local_1168 [256];
  char *local_1068 [2];
  ulong local_1058;
  char *local_1048;
  char local_1038 [4104];
  
  if ((int)l <= (int)this->level) {
    local_1058 = (ulong)(uint)obj_1;
    local_1048 = obj_2;
    local_1068[0] = obj;
    sVar2 = strlen(format_str);
    local_1180 = 0;
    local_1178 = 0xfff;
    local_11a0.size_ = 0;
    local_11a0.capacity_ = 0x100;
    local_11a0._vptr_buffer = (_func_int **)&PTR_grow_00129a00;
    local_1170 = local_1038;
    format_str_00.size_ = sVar2;
    format_str_00.data_ = format_str;
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_1068;
    args.desc_ = 0xc1c;
    local_11a0.ptr_ = local_1168;
    fmt::v7::detail::vformat_to<char>(&local_11a0,format_str_00,args);
    uVar4 = local_1178 - local_1180;
    local_1180 = local_1180 + local_11a0.size_;
    if (local_11a0.size_ <= uVar4) {
      uVar4 = local_11a0.size_;
    }
    if (uVar4 != 0) {
      memmove(local_1170,local_1168,uVar4);
    }
    uVar4 = local_1180;
    uVar3 = 0xfff;
    if (local_1180 < 0x1000) {
      uVar3 = local_1180;
    }
    local_1038[uVar3] = '\0';
    this_00 = (this->transports).
              super__Vector_base<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar1 = (this->transports).
             super__Vector_base<nodecpp::log::LogTransport,_std::allocator<nodecpp::log::LogTransport>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pLVar1) {
      do {
        local_11a8 = (ModuleID)mid->str;
        LogTransport::writoToLog(this_00,&local_11a8,local_1038,uVar4,l,this->addTimeStamp);
        this_00 = this_00 + 1;
      } while (this_00 != pLVar1);
    }
  }
  return;
}

Assistant:

void log( ModuleID mid, LogLevel l, StringT format_str, Objects ... obj ) {
			if ( l <= level ) {
				char msgFormatted[LogBufferBaseData::maxMessageSize];
				auto r = ::fmt::format_to_n( msgFormatted, LogBufferBaseData::maxMessageSize-1, format_str, obj ... );
				if ( r.size >= LogBufferBaseData::maxMessageSize )
					msgFormatted[LogBufferBaseData::maxMessageSize-1] = 0;
				else
					msgFormatted[r.size] = 0;
				for ( auto& transport : transports )
					transport.writoToLog( mid, msgFormatted, r.size, l, addTimeStamp );
			}				 
		}